

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash.cc
# Opt level: O1

bool __thiscall kratos::XXHash64::add(XXHash64 *this,void *input,uint64_t length)

{
  uchar uVar1;
  long lVar2;
  bool bVar3;
  uint64_t *block;
  long *plVar4;
  ulong uVar5;
  uint64_t uVar6;
  uint uVar7;
  uint64_t uVar8;
  ulong uVar9;
  uint64_t uVar10;
  uint64_t uVar11;
  
  bVar3 = length != 0 && input != (void *)0x0;
  if (length != 0 && input != (void *)0x0) {
    this->totalLength = this->totalLength + length;
    if (0x1f < this->bufferSize + length) {
      plVar4 = (long *)input;
      if (this->bufferSize != 0) {
        uVar7 = this->bufferSize;
        while (uVar7 < 0x20) {
          lVar2 = *plVar4;
          plVar4 = (long *)((long)plVar4 + 1);
          this->bufferSize = uVar7 + 1;
          this->buffer[uVar7] = (uchar)lVar2;
          uVar7 = this->bufferSize;
        }
        uVar9 = *(long *)this->buffer * -0x3d4d51c2d82b14b1 + this->state[0];
        this->state[0] = (uVar9 * 0x80000000 | uVar9 >> 0x21) * -0x61c8864e7a143579;
        uVar9 = *(long *)(this->buffer + 8) * -0x3d4d51c2d82b14b1 + this->state[1];
        this->state[1] = (uVar9 * 0x80000000 | uVar9 >> 0x21) * -0x61c8864e7a143579;
        uVar9 = *(long *)(this->buffer + 0x10) * -0x3d4d51c2d82b14b1 + this->state[2];
        this->state[2] = (uVar9 * 0x80000000 | uVar9 >> 0x21) * -0x61c8864e7a143579;
        uVar9 = *(long *)(this->buffer + 0x18) * -0x3d4d51c2d82b14b1 + this->state[3];
        this->state[3] = (uVar9 * 0x80000000 | uVar9 >> 0x21) * -0x61c8864e7a143579;
      }
      uVar8 = this->state[0];
      uVar6 = this->state[1];
      uVar11 = this->state[2];
      uVar10 = this->state[3];
      for (; plVar4 <= (long *)((long)input + (length - 0x20)); plVar4 = plVar4 + 4) {
        uVar9 = *plVar4 * -0x3d4d51c2d82b14b1 + uVar8;
        uVar5 = plVar4[1] * -0x3d4d51c2d82b14b1 + uVar6;
        uVar8 = (uVar9 * 0x80000000 | uVar9 >> 0x21) * -0x61c8864e7a143579;
        uVar6 = (uVar5 * 0x80000000 | uVar5 >> 0x21) * -0x61c8864e7a143579;
        uVar5 = plVar4[2] * -0x3d4d51c2d82b14b1 + uVar11;
        uVar9 = plVar4[3] * -0x3d4d51c2d82b14b1 + uVar10;
        uVar11 = (uVar5 * 0x80000000 | uVar5 >> 0x21) * -0x61c8864e7a143579;
        uVar10 = (uVar9 * 0x80000000 | uVar9 >> 0x21) * -0x61c8864e7a143579;
      }
      this->state[0] = uVar8;
      this->state[1] = uVar6;
      this->state[2] = uVar11;
      this->state[3] = uVar10;
      uVar7 = ((int)input + (int)length) - (int)plVar4;
      this->bufferSize = uVar7;
      if (uVar7 != 0) {
        uVar9 = 0;
        do {
          this->buffer[uVar9] = *(uchar *)((long)plVar4 + uVar9);
          uVar9 = uVar9 + 1;
        } while (uVar9 < this->bufferSize);
      }
      return bVar3;
    }
    uVar8 = 0;
    do {
      uVar1 = *(uchar *)((long)input + uVar8);
      uVar7 = this->bufferSize;
      this->bufferSize = uVar7 + 1;
      this->buffer[uVar7] = uVar1;
      uVar8 = uVar8 + 1;
    } while (length != uVar8);
  }
  return bVar3;
}

Assistant:

bool add(const void* input, uint64_t length) {
        // no data ?
        if (!input || length == 0) return false;

        totalLength += length;
        // byte-wise access
        auto const* data = (const unsigned char*)input;

        // unprocessed old data plus new data still fit in temporary buffer ?
        if (bufferSize + length < MaxBufferSize) {
            // just add new data
            while (length-- > 0) buffer[bufferSize++] = *data++;
            return true;
        }

        // point beyond last byte
        const unsigned char* stop = data + length;
        const unsigned char* stopBlock = stop - MaxBufferSize;

        // some data left from previous update ?
        if (bufferSize > 0) {
            // make sure temporary buffer is full (16 bytes)
            while (bufferSize < MaxBufferSize) buffer[bufferSize++] = *data++;

            // process these 32 bytes (4x8)
            process(buffer, state[0], state[1], state[2], state[3]);
        }

        // copying state to local variables helps optimizer A LOT
        uint64_t s0 = state[0], s1 = state[1], s2 = state[2], s3 = state[3];
        // 32 bytes at once
        while (data <= stopBlock) {
            // local variables s0..s3 instead of state[0]..state[3] are much faster
            process(data, s0, s1, s2, s3);
            data += 32;
        }
        // copy back
        state[0] = s0;
        state[1] = s1;
        state[2] = s2;
        state[3] = s3;

        // copy remainder to temporary buffer
        bufferSize = stop - data;
        for (unsigned int i = 0; i < bufferSize; i++) buffer[i] = data[i];

        // done
        return true;
    }